

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O3

FT_Error sfnt_load_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  FT_String **name;
  FT_String **name_00;
  FT_Long *pFVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  FT_UShort FVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  FT_Encoding FVar9;
  void *pvVar10;
  FT_Incremental_InterfaceRec *pFVar11;
  FT_CharMap *ppFVar12;
  FT_CharMap pFVar13;
  FT_Memory memory;
  undefined1 auVar14 [12];
  short sVar15;
  FT_Error FVar16;
  int iVar17;
  uint uVar18;
  TT_Table pTVar19;
  FT_String *pFVar20;
  ulong uVar21;
  long lVar22;
  FT_Bitmap_Size *pFVar23;
  FT_UInt *pFVar24;
  FT_UShort *pFVar25;
  ulong uVar26;
  TT_Table pTVar27;
  undefined8 uVar28;
  TT_Table pTVar29;
  TT_Table pTVar30;
  long lVar31;
  ulong uVar32;
  ulong new_count;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  FT_CharMapRec cmaprec;
  uint local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  FT_Pointer local_78;
  FT_Memory local_70;
  FT_CharMapRec_ local_68 [2];
  uint local_40;
  undefined1 auVar36 [16];
  
  uVar26 = (ulong)(uint)num_params;
  if (num_params < 1) {
    local_80 = 0;
    bVar33 = false;
  }
  else {
    uVar26 = 0;
    bVar33 = false;
    local_80 = 0;
    do {
      lVar22 = *(long *)((long)&params->tag + uVar26);
      if (lVar22 == 0x69677066) {
        bVar33 = true;
      }
      else if (lVar22 == 0x69677073) {
        local_80 = 1;
      }
      uVar26 = uVar26 + 0x10;
    } while ((ulong)(uint)num_params << 4 != uVar26);
  }
  local_84 = (int)CONCAT71((int7)(uVar26 >> 8),1);
  bVar34 = true;
  if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    if (face->num_tables != 0) {
      pTVar27 = face->dir_tables;
      pTVar19 = pTVar27 + face->num_tables;
      pTVar29 = pTVar27;
      do {
        if ((pTVar29->Tag == 0x676c7966) && (pTVar29->Length != 0)) goto LAB_0015e75f;
        pTVar29 = pTVar29 + 1;
        pTVar30 = pTVar27;
      } while (pTVar29 < pTVar19);
      do {
        if ((pTVar30->Tag == 0x43464620) && (pTVar30->Length != 0)) goto LAB_0015e75f;
        pTVar30 = pTVar30 + 1;
      } while (pTVar30 < pTVar19);
      do {
        if ((pTVar27->Tag == 0x43464632) && (pTVar27->Length != 0)) goto LAB_0015e75f;
        pTVar27 = pTVar27 + 1;
      } while (pTVar27 < pTVar19);
    }
    bVar34 = false;
  }
LAB_0015e762:
  pvVar10 = face->sfnt;
  uVar28 = 0;
  FVar16 = (*face->goto_table)(face,0x73626978,stream,(FT_ULong *)0x0);
  if (FVar16 == 0) {
    bVar34 = false;
  }
  if ((bVar34) || (*(code **)((long)pvVar10 + 0x88) == (code *)0x0)) {
LAB_0015e78f:
    iVar17 = (**(code **)((long)pvVar10 + 0x30))(face,stream);
    if (iVar17 != 0) {
      return iVar17;
    }
    local_88 = 0;
  }
  else {
    iVar17 = (**(code **)((long)pvVar10 + 0x88))(face,stream);
    local_84 = (int)CONCAT71((int7)((ulong)uVar28 >> 8),iVar17 != 0);
    if ((FVar16 == 0) || (iVar17 != 0)) goto LAB_0015e78f;
    local_84 = 0;
  }
  if ((ushort)((face->header).Units_Per_EM + 0xbfff) < 0xc00f) {
    return 8;
  }
  (**(code **)((long)pvVar10 + 0x48))(face,stream);
  (**(code **)((long)pvVar10 + 0x40))(face,stream);
  (**(code **)((long)pvVar10 + 0x60))(face,stream);
  local_7c = (**(code **)((long)pvVar10 + 0x58))(face,stream);
  if ((char)local_84 != '\0') {
    local_88 = (**(code **)((long)pvVar10 + 0x38))(face,stream,0);
    if (local_88 == 0) {
      iVar17 = (**(code **)((long)pvVar10 + 0xb8))(face,stream,0);
      if ((char)iVar17 == -0x72) {
        local_88 = 0x93;
        goto LAB_0015e893;
      }
      if (iVar17 != 0) {
        return iVar17;
      }
      local_88 = 0;
    }
    else {
      if ((char)local_88 != -0x72) {
        return local_88;
      }
      if (face->format_tag == 0x74727565) {
        bVar34 = false;
      }
      else {
        local_88 = 0x8f;
LAB_0015e893:
        pFVar11 = ((face->root).internal)->incremental_interface;
        if (pFVar11 == (FT_Incremental_InterfaceRec *)0x0) {
          return local_88;
        }
        if (pFVar11->funcs->get_glyph_metrics == (FT_Incremental_GetGlyphMetricsFunc)0x0) {
          return local_88;
        }
        (face->horizontal).number_Of_HMetrics = 0;
      }
    }
    local_88 = (**(code **)((long)pvVar10 + 0x38))(face,stream,1);
    if ((local_88 == 0) &&
       (local_88 = (**(code **)((long)pvVar10 + 0xb8))(face,stream,1), local_88 == 0)) {
      face->vertical_info = '\x01';
    }
    else if ((char)local_88 != -0x72) {
      return local_88;
    }
    iVar17 = (**(code **)((long)pvVar10 + 0x50))(face,stream);
    if (iVar17 != 0) {
      (face->os2).version = 0xffff;
    }
  }
  if (*(code **)((long)pvVar10 + 0xc0) != (code *)0x0) {
    (**(code **)((long)pvVar10 + 0xc0))(face,stream);
  }
  (**(code **)((long)pvVar10 + 0x80))(face,stream);
  (**(code **)((long)pvVar10 + 0x78))(face,stream);
  (**(code **)((long)pvVar10 + 0x70))(face,stream);
  (face->root).num_glyphs = (ulong)(face->max_profile).numGlyphs;
  name = &(face->root).family_name;
  name_00 = &(face->root).style_name;
  (face->root).family_name = (FT_String *)0x0;
  (face->root).style_name = (FT_String *)0x0;
  if (((face->os2).version == 0xffff) || (((face->os2).fsSelection & 0x100) == 0)) {
    local_88 = tt_face_get_name(face,0x15,name);
    if (local_88 != 0) {
      return local_88;
    }
    pFVar20 = *name;
    if (!bVar33 && pFVar20 == (FT_String *)0x0) {
      FVar16 = tt_face_get_name(face,0x10,name);
      if (FVar16 != 0) {
        return FVar16;
      }
      pFVar20 = *name;
    }
    local_88 = 0;
    if ((pFVar20 == (FT_String *)0x0) && (FVar16 = tt_face_get_name(face,1,name), FVar16 != 0)) {
      return FVar16;
    }
    local_88 = 0;
    local_88 = tt_face_get_name(face,0x16,name_00);
    if (local_88 != 0) {
      return local_88;
    }
    pFVar20 = *name_00;
    uVar18 = 0;
    if ((char)local_80 == '\0' && pFVar20 == (FT_String *)0x0) {
      FVar16 = tt_face_get_name(face,0x11,name_00);
      if (FVar16 != 0) {
        return FVar16;
      }
      pFVar20 = *name_00;
      uVar18 = 0;
    }
  }
  else {
    if (bVar33) {
LAB_0015ea36:
      uVar18 = tt_face_get_name(face,1,name);
      if (uVar18 != 0) {
        return uVar18;
      }
    }
    else {
      FVar16 = tt_face_get_name(face,0x10,name);
      if (FVar16 != 0) {
        return FVar16;
      }
      local_88 = 0;
      uVar18 = 0;
      if (*name == (FT_String *)0x0) goto LAB_0015ea36;
    }
    local_88 = uVar18;
    if (((char)local_80 == '\0') && (local_88 = tt_face_get_name(face,0x11,name_00), local_88 != 0))
    {
      return local_88;
    }
    pFVar20 = *name_00;
    uVar18 = local_88;
  }
  local_88 = uVar18;
  if ((pFVar20 == (FT_String *)0x0) && (local_88 = tt_face_get_name(face,2,name_00), local_88 != 0))
  {
    return local_88;
  }
  uVar26 = (face->root).face_flags;
  uVar21 = uVar26 | 0x4000;
  if ((face->sbit_table_type & ~TT_SBIT_TABLE_TYPE_EBLC) != TT_SBIT_TABLE_TYPE_CBLC) {
    uVar21 = uVar26;
  }
  uVar26 = bVar34 | uVar21 | 0x18;
  if ((local_7c == 0) && ((face->postscript).FormatType != 0x30000)) {
    uVar26 = bVar34 | uVar21 | 0x218;
  }
  uVar21 = uVar26 | 4;
  if ((face->postscript).isFixedPitch == 0) {
    uVar21 = uVar26;
  }
  uVar26 = uVar21 | 0x20;
  if (face->vertical_info == '\0') {
    uVar26 = uVar21;
  }
  uVar21 = uVar26 | 0x40;
  if (face->kern_avail_bits == 0) {
    uVar21 = uVar26;
  }
  if (((face->variation_support & 1) != 0) && (face->num_tables != 0)) {
    pTVar27 = face->dir_tables;
    pTVar19 = pTVar27 + face->num_tables;
    pTVar29 = pTVar27;
    do {
      if ((pTVar29->Tag == 0x676c7966) && (pTVar30 = pTVar27, pTVar29->Length != 0))
      goto LAB_0015ebb0;
      pTVar29 = pTVar29 + 1;
    } while (pTVar29 < pTVar19);
LAB_0015ebd1:
    do {
      if ((pTVar27->Tag == 0x43464632) && (pTVar27->Length != 0)) {
        uVar21 = uVar21 | 0x100;
        break;
      }
      pTVar27 = pTVar27 + 1;
    } while (pTVar27 < pTVar19);
  }
  (face->root).face_flags = uVar21;
  if ((bVar34) && ((face->os2).version != 0xffff)) {
    uVar3 = (face->os2).fsSelection;
    uVar26 = (ulong)((uint)((uVar3 & 0x201) != 0) | uVar3 >> 4 & 2);
  }
  else {
    bVar2 = (byte)(face->header).Mac_Style;
    uVar26 = (ulong)(byte)((bVar2 & 2) >> 1 | bVar2 * '\x02') & 3;
  }
  pFVar1 = &(face->root).style_flags;
  *pFVar1 = *pFVar1 | uVar26;
  tt_face_build_cmaps(face);
  lVar22 = (long)(face->root).num_charmaps;
  if (0 < lVar22) {
    ppFVar12 = (face->root).charmaps;
    bVar33 = true;
    lVar31 = 0;
LAB_0015ec64:
    do {
      pFVar13 = ppFVar12[lVar31];
      uVar26 = 0xfffffffffffffff4;
      do {
        if ((*(uint *)((long)&DAT_0019df6c + uVar26) == (uint)pFVar13->platform_id) &&
           ((*(uint *)((long)&DAT_0019df70 + uVar26) == (uint)pFVar13->encoding_id ||
            (*(uint *)((long)&DAT_0019df70 + uVar26) == 0xffffffff)))) {
          FVar9 = *(FT_Encoding *)((long)&DAT_0019df74 + uVar26);
          pFVar13->encoding = FVar9;
          if ((FVar9 != FT_ENCODING_MS_SYMBOL) && (FVar9 != FT_ENCODING_UNICODE)) goto LAB_0015ecbe;
          lVar31 = lVar31 + 1;
          bVar33 = false;
          if (lVar31 != lVar22) goto LAB_0015ec64;
          goto LAB_0015ed23;
        }
        uVar26 = uVar26 + 0xc;
      } while (uVar26 < 0x78);
      pFVar13->encoding = FT_ENCODING_NONE;
LAB_0015ecbe:
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar22);
    if (!bVar33) goto LAB_0015ed23;
  }
  local_68[0].encoding = FT_ENCODING_UNICODE;
  local_68[0].platform_id = 3;
  local_68[0].encoding_id = 1;
  local_68[0].face = &face->root;
  local_88 = FT_CMap_New(&tt_cmap_unicode_class_rec.clazz,(FT_Pointer)0x0,local_68,
                         (FT_CMap_conflict *)0x0);
  bVar33 = local_88 != 0;
  bVar34 = (local_88 & 0xff) != 0xa3;
  if (!bVar34) {
    local_88 = 0;
  }
  if (bVar33 && bVar34) {
    return local_88;
  }
LAB_0015ed23:
  uVar26 = (ulong)face->sbit_num_strikes;
  if (uVar26 != 0) {
    memory = ((face->root).stream)->memory;
    uVar3 = (face->header).Units_Per_EM;
    uVar18 = (uint)uVar3;
    if ((uVar3 == 0) || ((face->os2).version == 0xffff)) {
      uVar18 = 1;
      local_84 = CONCAT22(local_84._2_2_,1);
    }
    else {
      local_84 = CONCAT22(local_84._2_2_,(face->os2).xAvgCharWidth);
    }
    pFVar23 = (FT_Bitmap_Size *)
              ft_mem_realloc(memory,0x20,0,uVar26,(void *)0x0,(FT_Error *)&local_88);
    (face->root).available_sizes = pFVar23;
    if (local_88 != 0) {
      return local_88;
    }
    local_78 = ft_mem_realloc(memory,4,0,uVar26,(void *)0x0,(FT_Error *)&local_88);
    if (local_88 != 0) {
      return local_88;
    }
    local_84 = (int)(short)local_84;
    local_7c = uVar18 >> 1;
    uVar32 = 0;
    uVar21 = 0;
    local_80 = uVar18;
    local_70 = memory;
    do {
      pFVar23 = (face->root).available_sizes;
      local_88 = (**(code **)((long)pvVar10 + 0xd8))(face,uVar32,local_68);
      new_count = uVar21;
      if (local_88 == 0) {
        pFVar23[uVar21].height = (FT_Short)(local_40 >> 6);
        pFVar23[uVar21].width =
             (FT_Short)((int)((uint)(ushort)local_68[0].face * local_84 + local_7c) / (int)local_80)
        ;
        pFVar23[uVar21].x_ppem = ((ulong)local_68[0].face & 0xffff) << 6;
        pFVar23[uVar21].y_ppem = (ulong)local_68[0].face._2_2_ << 6;
        pFVar23[uVar21].size = (ulong)local_68[0].face._2_2_ << 6;
        if (local_68[0].face._2_2_ != 0 && (ushort)local_68[0].face != 0) {
          new_count = (ulong)((int)uVar21 + 1);
          *(int *)((long)local_78 + uVar21 * 4) = (int)uVar32;
        }
      }
      uVar32 = uVar32 + 1;
      uVar21 = new_count;
    } while (uVar26 != uVar32);
    pFVar24 = (FT_UInt *)ft_mem_realloc(local_70,4,uVar26,new_count,local_78,(FT_Error *)&local_88);
    if ((int)new_count != 0) {
      face->sbit_strike_map = pFVar24;
      pFVar1 = &(face->root).face_flags;
      *(byte *)pFVar1 = (byte)*pFVar1 | 2;
      (face->root).num_fixed_sizes = (int)new_count;
    }
  }
  uVar26 = (face->root).face_flags;
  if ((uVar26 & 3) == 0) {
    uVar26 = uVar26 | 1;
    (face->root).face_flags = uVar26;
  }
  if ((uVar26 & 1) != 0) {
    uVar26._0_2_ = (face->header).xMin;
    uVar26._2_2_ = (face->header).yMin;
    uVar26._4_2_ = (face->header).xMax;
    uVar26._6_2_ = (face->header).yMax;
    auVar36._8_4_ = 0;
    auVar36._0_8_ = uVar26;
    auVar36._12_2_ = uVar26._6_2_;
    auVar36._14_2_ = uVar26._6_2_;
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar26;
    auVar35._10_2_ = uVar26._4_2_;
    auVar37._10_6_ = auVar35._10_6_;
    auVar37._8_2_ = uVar26._4_2_;
    auVar37._0_8_ = uVar26;
    auVar14._4_8_ = auVar37._8_8_;
    auVar14._2_2_ = uVar26._2_2_;
    auVar14._0_2_ = uVar26._2_2_;
    (face->root).bbox.xMin =
         CONCAT44(-(uint)((short)(undefined2)uVar26 < 0),(int)(short)(undefined2)uVar26);
    *(int *)&(face->root).bbox.xMax = auVar14._0_4_ >> 0x10;
    *(uint *)((long)&(face->root).bbox.xMax + 4) = -(uint)(auVar14._0_4_ < 0);
    uVar18._0_2_ = (face->header).xMax;
    uVar18._2_2_ = (face->header).yMax;
    auVar37 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0x60);
    iVar17 = auVar37._4_4_ >> 0x10;
    (face->root).bbox.xMax = CONCAT44(-(uint)(auVar37._0_4_ < 0),auVar37._0_4_ >> 0x10);
    (face->root).units_per_EM = (short)iVar17;
    (face->root).ascender = (short)((uint)iVar17 >> 0x10);
    *(uint *)&(face->root).descender = -(uint)(auVar37._4_4_ < 0);
    (face->root).units_per_EM = (face->header).Units_Per_EM;
    uVar6 = (face->horizontal).Ascender;
    (face->root).ascender = uVar6;
    sVar15 = (face->horizontal).Descender;
    (face->root).descender = sVar15;
    (face->root).height = (uVar6 - sVar15) + (face->horizontal).Line_Gap;
    if ((sVar15 == 0 && uVar6 == 0) && ((face->os2).version != 0xffff)) {
      sVar15 = (face->os2).sTypoAscender;
      sVar4 = (face->os2).sTypoDescender;
      if (sVar15 == 0 && sVar4 == 0) {
        uVar7 = (face->os2).usWinAscent;
        (face->root).ascender = uVar7;
        FVar5 = (face->os2).usWinDescent;
        (face->root).descender = -FVar5;
        sVar15 = FVar5 + uVar7;
      }
      else {
        (face->root).ascender = sVar15;
        (face->root).descender = sVar4;
        sVar15 = (sVar15 - sVar4) + (face->os2).sTypoLineGap;
      }
      (face->root).height = sVar15;
    }
    (face->root).max_advance_width = (face->horizontal).advance_Width_Max;
    pFVar25 = &(face->vertical).advance_Height_Max;
    if (face->vertical_info == '\0') {
      pFVar25 = (FT_UShort *)&(face->root).height;
    }
    (face->root).max_advance_height = *pFVar25;
    uVar8 = (face->postscript).underlinePosition;
    sVar15 = (face->postscript).underlineThickness;
    (face->root).underline_position = uVar8 - sVar15 / 2;
    (face->root).underline_thickness = sVar15;
  }
  return local_88;
LAB_0015e75f:
  bVar34 = true;
  goto LAB_0015e762;
  while (pTVar30 = pTVar30 + 1, pTVar30 < pTVar19) {
LAB_0015ebb0:
    if ((pTVar30->Tag == 0x67766172) && (pTVar30->Length != 0)) {
      uVar21 = uVar21 | 0x100;
      break;
    }
  }
  goto LAB_0015ebd1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_load_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    FT_Error      psnames_error;
#endif
    FT_Bool       has_outline;
    FT_Bool       is_apple_sbit;
    FT_Bool       is_apple_sbix;
    FT_Bool       ignore_typographic_family    = FALSE;
    FT_Bool       ignore_typographic_subfamily = FALSE;

    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

    FT_UNUSED( face_instance_index );


    /* Check parameters */

    {
      FT_Int  i;


      for ( i = 0; i < num_params; i++ )
      {
        if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_FAMILY )
          ignore_typographic_family = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_SUBFAMILY )
          ignore_typographic_subfamily = TRUE;
      }
    }

    /* Load tables */

    /* We now support two SFNT-based bitmapped font formats.  They */
    /* are recognized easily as they do not include a `glyf'       */
    /* table.                                                      */
    /*                                                             */
    /* The first format comes from Apple, and uses a table named   */
    /* `bhed' instead of `head' to store the font header (using    */
    /* the same format).  It also doesn't include horizontal and   */
    /* vertical metrics tables (i.e. `hhea' and `vhea' tables are  */
    /* missing).                                                   */
    /*                                                             */
    /* The other format comes from Microsoft, and is used with     */
    /* WinCE/PocketPC.  It looks like a standard TTF, except that  */
    /* it doesn't contain outlines.                                */
    /*                                                             */

    FT_TRACE2(( "sfnt_load_face: %08p\n\n", face ));

    /* do we have outlines in there? */
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    has_outline = FT_BOOL( face->root.internal->incremental_interface ||
                           tt_face_lookup_table( face, TTAG_glyf )    ||
                           tt_face_lookup_table( face, TTAG_CFF )     ||
                           tt_face_lookup_table( face, TTAG_CFF2 )    );
#else
    has_outline = FT_BOOL( tt_face_lookup_table( face, TTAG_glyf ) ||
                           tt_face_lookup_table( face, TTAG_CFF )  ||
                           tt_face_lookup_table( face, TTAG_CFF2 ) );
#endif

    is_apple_sbit = 0;
    is_apple_sbix = !face->goto_table( face, TTAG_sbix, stream, 0 );

    /* Apple 'sbix' color bitmaps are rendered scaled and then the 'glyf'
     * outline rendered on top.  We don't support that yet, so just ignore
     * the 'glyf' outline and advertise it as a bitmap-only font. */
    if ( is_apple_sbix )
      has_outline = FALSE;

    /* if this font doesn't contain outlines, we try to load */
    /* a `bhed' table                                        */
    if ( !has_outline && sfnt->load_bhed )
    {
      LOAD_( bhed );
      is_apple_sbit = FT_BOOL( !error );
    }

    /* load the font header (`head' table) if this isn't an Apple */
    /* sbit font file                                             */
    if ( !is_apple_sbit || is_apple_sbix )
    {
      LOAD_( head );
      if ( error )
        goto Exit;
    }

    /* OpenType 1.8.2 introduced limits to this value;    */
    /* however, they make sense for older SFNT fonts also */
    if ( face->header.Units_Per_EM <    16 ||
         face->header.Units_Per_EM > 16384 )
    {
      error = FT_THROW( Invalid_Table );

      goto Exit;
    }

    /* the following tables are often not present in embedded TrueType */
    /* fonts within PDF documents, so don't check for them.            */
    LOAD_( maxp );
    LOAD_( cmap );

    /* the following tables are optional in PCL fonts -- */
    /* don't check for errors                            */
    LOAD_( name );
    LOAD_( post );

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    psnames_error = error;
#endif

    /* do not load the metrics headers and tables if this is an Apple */
    /* sbit font file                                                 */
    if ( !is_apple_sbit )
    {
      /* load the `hhea' and `hmtx' tables */
      LOADM_( hhea, 0 );
      if ( !error )
      {
        LOADM_( hmtx, 0 );
        if ( FT_ERR_EQ( error, Table_Missing ) )
        {
          error = FT_THROW( Hmtx_Table_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hmtx' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif
        }
      }
      else if ( FT_ERR_EQ( error, Table_Missing ) )
      {
        /* No `hhea' table necessary for SFNT Mac fonts. */
        if ( face->format_tag == TTAG_true )
        {
          FT_TRACE2(( "This is an SFNT Mac font.\n" ));

          has_outline = 0;
          error       = FT_Err_Ok;
        }
        else
        {
          error = FT_THROW( Horiz_Header_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hhea' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif

        }
      }

      if ( error )
        goto Exit;

      /* try to load the `vhea' and `vmtx' tables */
      LOADM_( hhea, 1 );
      if ( !error )
      {
        LOADM_( hmtx, 1 );
        if ( !error )
          face->vertical_info = 1;
      }

      if ( error && FT_ERR_NEQ( error, Table_Missing ) )
        goto Exit;

      LOAD_( os2 );
      if ( error )
      {
        /* we treat the table as missing if there are any errors */
        face->os2.version = 0xFFFFU;
      }
    }

    /* the optional tables */

    /* embedded bitmap support */
    if ( sfnt->load_eblc )
      LOAD_( eblc );

    /* consider the pclt, kerning, and gasp tables as optional */
    LOAD_( pclt );
    LOAD_( gasp );
    LOAD_( kern );

    face->root.num_glyphs = face->max_profile.numGlyphs;

    /* Bit 8 of the `fsSelection' field in the `OS/2' table denotes  */
    /* a WWS-only font face.  `WWS' stands for `weight', width', and */
    /* `slope', a term used by Microsoft's Windows Presentation      */
    /* Foundation (WPF).  This flag has been introduced in version   */
    /* 1.5 of the OpenType specification (May 2008).                 */

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
    if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 256 )
    {
      if ( !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      if ( !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }
    else
    {
      GET_NAME( WWS_FAMILY, &face->root.family_name );
      if ( !face->root.family_name && !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      GET_NAME( WWS_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name && !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }

    /* now set up root fields */
    {
      FT_Face  root  = &face->root;
      FT_Long  flags = root->face_flags;


      /*********************************************************************/
      /*                                                                   */
      /* Compute face flags.                                               */
      /*                                                                   */
      if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_CBLC ||
           face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX )
        flags |= FT_FACE_FLAG_COLOR;      /* color glyphs */

      if ( has_outline == TRUE )
        flags |= FT_FACE_FLAG_SCALABLE;   /* scalable outlines */

      /* The sfnt driver only supports bitmap fonts natively, thus we */
      /* don't set FT_FACE_FLAG_HINTER.                               */
      flags |= FT_FACE_FLAG_SFNT       |  /* SFNT file format  */
               FT_FACE_FLAG_HORIZONTAL;   /* horizontal data   */

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
      if ( !psnames_error                             &&
           face->postscript.FormatType != 0x00030000L )
        flags |= FT_FACE_FLAG_GLYPH_NAMES;
#endif

      /* fixed width font? */
      if ( face->postscript.isFixedPitch )
        flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* vertical information? */
      if ( face->vertical_info )
        flags |= FT_FACE_FLAG_VERTICAL;

      /* kerning available ? */
      if ( TT_FACE_HAS_KERNING( face ) )
        flags |= FT_FACE_FLAG_KERNING;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* Don't bother to load the tables unless somebody asks for them. */
      /* No need to do work which will (probably) not be used.          */
      if ( face->variation_support & TT_FACE_FLAG_VAR_FVAR )
      {
        if ( tt_face_lookup_table( face, TTAG_glyf ) != 0 &&
             tt_face_lookup_table( face, TTAG_gvar ) != 0 )
          flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
        if ( tt_face_lookup_table( face, TTAG_CFF2 ) != 0 )
          flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
      }
#endif

      root->face_flags = flags;

      /*********************************************************************/
      /*                                                                   */
      /* Compute style flags.                                              */
      /*                                                                   */

      flags = 0;
      if ( has_outline == TRUE && face->os2.version != 0xFFFFU )
      {
        /* We have an OS/2 table; use the `fsSelection' field.  Bit 9 */
        /* indicates an oblique font face.  This flag has been        */
        /* introduced in version 1.5 of the OpenType specification.   */

        if ( face->os2.fsSelection & 512 )       /* bit 9 */
          flags |= FT_STYLE_FLAG_ITALIC;
        else if ( face->os2.fsSelection & 1 )    /* bit 0 */
          flags |= FT_STYLE_FLAG_ITALIC;

        if ( face->os2.fsSelection & 32 )        /* bit 5 */
          flags |= FT_STYLE_FLAG_BOLD;
      }
      else
      {
        /* this is an old Mac font, use the header field */

        if ( face->header.Mac_Style & 1 )
          flags |= FT_STYLE_FLAG_BOLD;

        if ( face->header.Mac_Style & 2 )
          flags |= FT_STYLE_FLAG_ITALIC;
      }

      root->style_flags |= flags;

      /*********************************************************************/
      /*                                                                   */
      /* Polish the charmaps.                                              */
      /*                                                                   */
      /*   Try to set the charmap encoding according to the platform &     */
      /*   encoding ID of each charmap.  Emulate Unicode charmap if one    */
      /*   is missing.                                                     */
      /*                                                                   */

      tt_face_build_cmaps( face );  /* ignore errors */


      /* set the encoding fields */
      {
        FT_Int   m;
#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
        FT_Bool  has_unicode = FALSE;
#endif


        for ( m = 0; m < root->num_charmaps; m++ )
        {
          FT_CharMap  charmap = root->charmaps[m];


          charmap->encoding = sfnt_find_encoding( charmap->platform_id,
                                                  charmap->encoding_id );

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES

          if ( charmap->encoding == FT_ENCODING_UNICODE   ||
               charmap->encoding == FT_ENCODING_MS_SYMBOL )  /* PUA */
            has_unicode = TRUE;
        }

        /* synthesize Unicode charmap if one is missing */
        if ( !has_unicode )
        {
          FT_CharMapRec cmaprec;


          cmaprec.face        = root;
          cmaprec.platform_id = TT_PLATFORM_MICROSOFT;
          cmaprec.encoding_id = TT_MS_ID_UNICODE_CS;
          cmaprec.encoding    = FT_ENCODING_UNICODE;


          error = FT_CMap_New( (FT_CMap_Class)&tt_cmap_unicode_class_rec,
                               NULL, &cmaprec, NULL );
          if ( error                                      &&
               FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
            goto Exit;
          error = FT_Err_Ok;

#endif /* FT_CONFIG_OPTION_POSTSCRIPT_NAMES */

        }
      }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

      /*
       *  Now allocate the root array of FT_Bitmap_Size records and
       *  populate them.  Unfortunately, it isn't possible to indicate bit
       *  depths in the FT_Bitmap_Size record.  This is a design error.
       */
      {
        FT_UInt  count;


        count = face->sbit_num_strikes;

        if ( count > 0 )
        {
          FT_Memory        memory   = face->root.stream->memory;
          FT_UShort        em_size  = face->header.Units_Per_EM;
          FT_Short         avgwidth = face->os2.xAvgCharWidth;
          FT_Size_Metrics  metrics;

          FT_UInt*  sbit_strike_map = NULL;
          FT_UInt   strike_idx, bsize_idx;


          if ( em_size == 0 || face->os2.version == 0xFFFFU )
          {
            avgwidth = 1;
            em_size = 1;
          }

          /* to avoid invalid strike data in the `available_sizes' field */
          /* of `FT_Face', we map `available_sizes' indices to strike    */
          /* indices                                                     */
          if ( FT_NEW_ARRAY( root->available_sizes, count ) ||
               FT_NEW_ARRAY( sbit_strike_map, count ) )
            goto Exit;

          bsize_idx = 0;
          for ( strike_idx = 0; strike_idx < count; strike_idx++ )
          {
            FT_Bitmap_Size*  bsize = root->available_sizes + bsize_idx;


            error = sfnt->load_strike_metrics( face, strike_idx, &metrics );
            if ( error )
              continue;

            bsize->height = (FT_Short)( metrics.height >> 6 );
            bsize->width  = (FT_Short)(
              ( avgwidth * metrics.x_ppem + em_size / 2 ) / em_size );

            bsize->x_ppem = metrics.x_ppem << 6;
            bsize->y_ppem = metrics.y_ppem << 6;

            /* assume 72dpi */
            bsize->size   = metrics.y_ppem << 6;

            /* only use strikes with valid PPEM values */
            if ( bsize->x_ppem && bsize->y_ppem )
              sbit_strike_map[bsize_idx++] = strike_idx;
          }

          /* reduce array size to the actually used elements */
          (void)FT_RENEW_ARRAY( sbit_strike_map, count, bsize_idx );

          /* from now on, all strike indices are mapped */
          /* using `sbit_strike_map'                    */
          if ( bsize_idx )
          {
            face->sbit_strike_map = sbit_strike_map;

            root->face_flags     |= FT_FACE_FLAG_FIXED_SIZES;
            root->num_fixed_sizes = (FT_Int)bsize_idx;
          }
        }
      }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

      /* a font with no bitmaps and no outlines is scalable; */
      /* it has only empty glyphs then                       */
      if ( !FT_HAS_FIXED_SIZES( root ) && !FT_IS_SCALABLE( root ) )
        root->face_flags |= FT_FACE_FLAG_SCALABLE;


      /*********************************************************************/
      /*                                                                   */
      /*  Set up metrics.                                                  */
      /*                                                                   */
      if ( FT_IS_SCALABLE( root ) )
      {
        /* XXX What about if outline header is missing */
        /*     (e.g. sfnt wrapped bitmap)?             */
        root->bbox.xMin    = face->header.xMin;
        root->bbox.yMin    = face->header.yMin;
        root->bbox.xMax    = face->header.xMax;
        root->bbox.yMax    = face->header.yMax;
        root->units_per_EM = face->header.Units_Per_EM;


        /* XXX: Computing the ascender/descender/height is very different */
        /*      from what the specification tells you.  Apparently, we    */
        /*      must be careful because                                   */
        /*                                                                */
        /*      - not all fonts have an OS/2 table; in this case, we take */
        /*        the values in the horizontal header.  However, these    */
        /*        values very often are not reliable.                     */
        /*                                                                */
        /*      - otherwise, the correct typographic values are in the    */
        /*        sTypoAscender, sTypoDescender & sTypoLineGap fields.    */
        /*                                                                */
        /*        However, certain fonts have these fields set to 0.      */
        /*        Rather, they have usWinAscent & usWinDescent correctly  */
        /*        set (but with different values).                        */
        /*                                                                */
        /*      As an example, Arial Narrow is implemented through four   */
        /*      files ARIALN.TTF, ARIALNI.TTF, ARIALNB.TTF & ARIALNBI.TTF */
        /*                                                                */
        /*      Strangely, all fonts have the same values in their        */
        /*      sTypoXXX fields, except ARIALNB which sets them to 0.     */
        /*                                                                */
        /*      On the other hand, they all have different                */
        /*      usWinAscent/Descent values -- as a conclusion, the OS/2   */
        /*      table cannot be used to compute the text height reliably! */
        /*                                                                */

        /* The ascender and descender are taken from the `hhea' table. */
        /* If zero, they are taken from the `OS/2' table.              */

        root->ascender  = face->horizontal.Ascender;
        root->descender = face->horizontal.Descender;

        root->height = root->ascender - root->descender +
                       face->horizontal.Line_Gap;

        if ( !( root->ascender || root->descender ) )
        {
          if ( face->os2.version != 0xFFFFU )
          {
            if ( face->os2.sTypoAscender || face->os2.sTypoDescender )
            {
              root->ascender  = face->os2.sTypoAscender;
              root->descender = face->os2.sTypoDescender;

              root->height = root->ascender - root->descender +
                             face->os2.sTypoLineGap;
            }
            else
            {
              root->ascender  =  (FT_Short)face->os2.usWinAscent;
              root->descender = -(FT_Short)face->os2.usWinDescent;

              root->height = root->ascender - root->descender;
            }
          }
        }

        root->max_advance_width  =
          (FT_Short)face->horizontal.advance_Width_Max;
        root->max_advance_height =
          (FT_Short)( face->vertical_info ? face->vertical.advance_Height_Max
                                          : root->height );

        /* See https://www.microsoft.com/typography/otspec/post.htm -- */
        /* Adjust underline position from top edge to centre of        */
        /* stroke to convert TrueType meaning to FreeType meaning.     */
        root->underline_position  = face->postscript.underlinePosition -
                                    face->postscript.underlineThickness / 2;
        root->underline_thickness = face->postscript.underlineThickness;
      }

    }

  Exit:
    FT_TRACE2(( "sfnt_load_face: done\n" ));

    return error;
  }